

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setIconSize(QComboBox *this,QSize *size)

{
  long lVar1;
  bool bVar2;
  QComboBoxPrivate *size_00;
  QSize *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QSize *in_stack_ffffffffffffffc8;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size_00 = d_func((QComboBox *)0x537f4f);
  bVar2 = ::operator==((QSize *)in_RDI,in_stack_ffffffffffffffc8);
  if (!bVar2) {
    view((QComboBox *)in_RDI);
    QAbstractItemView::setIconSize((QAbstractItemView *)in_RSI,(QSize *)size_00);
    size_00->iconSize = *in_RSI;
    QSize::QSize((QSize *)in_RDI);
    size_00->sizeHint = local_10;
    QWidget::updateGeometry(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::setIconSize(const QSize &size)
{
    Q_D(QComboBox);
    if (size == d->iconSize)
        return;

    view()->setIconSize(size);
    d->iconSize = size;
    d->sizeHint = QSize();
    updateGeometry();
}